

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabBarCloseTab(ImGuiTabBar *tab_bar,ImGuiTabItem *tab)

{
  ImGuiTabItem *tab_local;
  ImGuiTabBar *tab_bar_local;
  
  if ((tab->Flags & 0x200000U) == 0) {
    if ((tab->Flags & 1U) == 0) {
      tab->WantClose = true;
      if (tab_bar->VisibleTabId == tab->ID) {
        tab->LastFrameVisible = -1;
        tab_bar->NextSelectedTabId = 0;
        tab_bar->SelectedTabId = 0;
      }
    }
    else if (tab_bar->VisibleTabId != tab->ID) {
      tab_bar->NextSelectedTabId = tab->ID;
    }
    return;
  }
  __assert_fail("!(tab->Flags & ImGuiTabItemFlags_Button)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                ,0x1cf1,"void ImGui::TabBarCloseTab(ImGuiTabBar *, ImGuiTabItem *)");
}

Assistant:

void ImGui::TabBarCloseTab(ImGuiTabBar* tab_bar, ImGuiTabItem* tab)
{
    IM_ASSERT(!(tab->Flags & ImGuiTabItemFlags_Button));
    if (!(tab->Flags & ImGuiTabItemFlags_UnsavedDocument))
    {
        // This will remove a frame of lag for selecting another tab on closure.
        // However we don't run it in the case where the 'Unsaved' flag is set, so user gets a chance to fully undo the closure
        tab->WantClose = true;
        if (tab_bar->VisibleTabId == tab->ID)
        {
            tab->LastFrameVisible = -1;
            tab_bar->SelectedTabId = tab_bar->NextSelectedTabId = 0;
        }
    }
    else
    {
        // Actually select before expecting closure attempt (on an UnsavedDocument tab user is expect to e.g. show a popup)
        if (tab_bar->VisibleTabId != tab->ID)
            tab_bar->NextSelectedTabId = tab->ID;
    }
}